

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefix)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  byte bVar7;
  ulong uVar8;
  size_t __n;
  byte *pbVar9;
  ulong __n_00;
  uint uVar10;
  bool bVar11;
  int l;
  xmlChar buf [105];
  int local_ac;
  byte local_a8 [120];
  
  if ((prefix == (xmlChar **)0x0) || (*prefix = (xmlChar *)0x0, name == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  bVar7 = *name;
  if (bVar7 == 0x3a) goto LAB_0015b97e;
  uVar5 = 0;
  while ((bVar7 != 0 && (bVar7 != 0x3a))) {
    if (uVar5 == 100) {
      __n = 100;
      goto LAB_0015b9ca;
    }
    local_a8[uVar5] = bVar7;
    lVar1 = uVar5 + 1;
    uVar5 = uVar5 + 1;
    bVar7 = name[lVar1];
  }
  __n = uVar5 & 0xffffffff;
LAB_0015b9ca:
  pbVar9 = name + uVar5 + 1;
  if ((uint)__n < 100) {
    pxVar4 = (xmlChar *)0x0;
    uVar2 = 100;
LAB_0015ba90:
    if ((bVar7 == 0x3a) && (*pbVar9 == 0)) {
      if (pxVar4 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4);
      }
      *prefix = (xmlChar *)0x0;
LAB_0015b97e:
      pxVar4 = xmlStrdup(name);
      return pxVar4;
    }
    uVar10 = 100;
    if (pxVar4 == (xmlChar *)0x0) {
      pxVar4 = xmlStrndup(local_a8,(int)__n);
      uVar10 = uVar2;
    }
    if (bVar7 != 0x3a) {
      return pxVar4;
    }
    bVar7 = *pbVar9;
    *prefix = pxVar4;
    if (bVar7 == 0) {
      pbVar9 = (byte *)0x1ff00a;
      iVar3 = 0;
    }
    else {
      if (((0x19 < (byte)((bVar7 & 0xdf) + 0xbf)) && (bVar7 != 0x3a)) && (bVar7 != 0x5f)) {
        uVar2 = xmlStringCurrentChar(ctxt,pbVar9,&local_ac);
        if ((int)uVar2 < 0x100) {
          if (((0x16 < uVar2 - 0xc0) && (0x19 < (uVar2 & 0xffffffdf) - 0x41)) &&
             ((int)uVar2 < 0xf8 && 0x1e < uVar2 - 0xd8)) {
LAB_0015bbaa:
            if ((int)uVar2 < 0x100) {
              if (uVar2 != 0x5f) {
LAB_0015bbe2:
                xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",
                                  name);
              }
            }
            else if ((uVar2 - 0x302a < 0xfffffff7 && uVar2 - 0x9fa6 < 0xffffae5a) && uVar2 != 0x3007
                    ) goto LAB_0015bbe2;
          }
        }
        else {
          iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
          if (iVar3 == 0) goto LAB_0015bbaa;
        }
      }
      pbVar9 = pbVar9 + 1;
      bVar11 = 0 < (int)uVar10;
      if ((int)uVar10 < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          local_a8[uVar5] = bVar7;
          bVar7 = pbVar9[uVar5];
          uVar5 = uVar5 + 1;
          bVar11 = uVar5 < uVar10;
          if (bVar7 == 0) break;
        } while (uVar5 < uVar10);
        pbVar9 = pbVar9 + uVar5;
      }
      iVar3 = (int)uVar5;
      if (bVar11) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        uVar8 = (ulong)(uint)(iVar3 * 2);
        pxVar4 = (xmlChar *)(*xmlMallocAtomic)(uVar8);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_0015bd13;
        __n_00 = uVar5 & 0xffffffff;
        memcpy(pxVar4,local_a8,__n_00);
        while (iVar3 = (int)uVar5, bVar7 != 0) {
          pxVar6 = pxVar4;
          if ((int)uVar8 < iVar3 + 10) {
            uVar8 = (ulong)(uint)((int)uVar8 * 2);
            pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar4,uVar8);
            if (pxVar6 == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              (*xmlFree)(pxVar4);
              return (xmlChar *)0x0;
            }
          }
          pxVar6[__n_00] = bVar7;
          __n_00 = __n_00 + 1;
          uVar5 = (ulong)(iVar3 + 1);
          bVar7 = *pbVar9;
          pxVar4 = pxVar6;
          pbVar9 = pbVar9 + 1;
        }
        pxVar4[uVar5 & 0xffffffff] = '\0';
      }
      if (pxVar4 != (xmlChar *)0x0) {
        return pxVar4;
      }
      pbVar9 = local_a8;
    }
    pxVar4 = xmlStrndup(pbVar9,iVar3);
  }
  else {
    uVar5 = (ulong)((uint)__n * 2);
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(uVar5);
    if (pxVar4 != (xmlChar *)0x0) {
      memcpy(pxVar4,local_a8,__n);
      while ((uVar2 = (uint)uVar5, bVar7 != 0 && (bVar7 != 0x3a))) {
        pxVar6 = pxVar4;
        if ((int)uVar2 < (int)__n + 10) {
          uVar5 = (ulong)(uVar2 * 2);
          pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar4,uVar5);
          if (pxVar6 == (xmlChar *)0x0) {
            (*xmlFree)(pxVar4);
            xmlErrMemory(ctxt,(char *)0x0);
            return (xmlChar *)0x0;
          }
        }
        pxVar6[__n] = bVar7;
        __n = __n + 1;
        bVar7 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        pxVar4 = pxVar6;
      }
      pxVar4[__n & 0xffffffff] = '\0';
      goto LAB_0015ba90;
    }
LAB_0015bd13:
    pxVar4 = (xmlChar *)0x0;
    xmlErrMemory(ctxt,(char *)0x0);
  }
  return pxVar4;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefix) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    const xmlChar *cur = name;
    int c;

    if (prefix == NULL) return(NULL);
    *prefix = NULL;

    if (cur == NULL) return(NULL);

#ifndef XML_XML_NAMESPACE
    /* xml: prefix is not really a namespace */
    if ((cur[0] == 'x') && (cur[1] == 'm') &&
        (cur[2] == 'l') && (cur[3] == ':'))
	return(xmlStrdup(name));
#endif

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	if (buffer == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;

		max *= 2;
		tmp = (xmlChar *) xmlRealloc(buffer,
						max * sizeof(xmlChar));
		if (tmp == NULL) {
		    xmlFree(buffer);
		    xmlErrMemory(ctxt, NULL);
		    return(NULL);
		}
		buffer = tmp;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	*prefix = NULL;
	return(xmlStrdup(name));
    }

    if (buffer == NULL)
	ret = xmlStrndup(buf, len);
    else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        *prefix = ret;
	if (c == 0) {
	    return(xmlStrndup(BAD_CAST "", 0));
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer,
						    max * sizeof(xmlChar));
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL)
	    ret = xmlStrndup(buf, len);
	else {
	    ret = buffer;
	}
    }

    return(ret);
}